

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<unsigned_int> * __thiscall
vkb::Device::get_queue_index
          (Result<unsigned_int> *__return_storage_ptr__,Device *this,QueueType type)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  pointer pVVar4;
  uint uVar5;
  
  switch(type) {
  case present:
    uVar2 = detail::get_present_queue_index
                      ((this->physical_device).physical_device,this->surface,&this->queue_families);
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0xffffffff) {
      bVar1 = false;
      (__return_storage_ptr__->field_0).m_value = 0;
      *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
      (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
      goto LAB_0011f2f1;
    }
    break;
  case graphics:
    pVVar4 = (this->queue_families).
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (int)((ulong)((long)(this->queue_families).
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) >> 3) *
            -0x55555555;
    if (uVar5 != 0) {
      uVar3 = 0;
      do {
        if ((pVVar4->queueFlags & 1) != 0) {
          if (uVar3 != 0xffffffff) goto LAB_0011f2ed;
          break;
        }
        uVar3 = uVar3 + 1;
        pVVar4 = pVVar4 + 1;
      } while (uVar5 != uVar3);
    }
    (__return_storage_ptr__->field_0).m_value = 1;
    goto LAB_0011f2d7;
  case compute:
    uVar2 = detail::get_separate_queue_index(&this->queue_families,2,4);
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0xffffffff) {
      (__return_storage_ptr__->field_0).m_value = 2;
      goto LAB_0011f2d7;
    }
    break;
  case transfer:
    uVar2 = detail::get_separate_queue_index(&this->queue_families,4,2);
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0xffffffff) {
      (__return_storage_ptr__->field_0).m_value = 3;
      goto LAB_0011f2d7;
    }
    break;
  default:
    (__return_storage_ptr__->field_0).m_value = 5;
LAB_0011f2d7:
    *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    bVar1 = false;
    goto LAB_0011f2f1;
  }
LAB_0011f2ed:
  (__return_storage_ptr__->field_0).m_value = (uint)uVar3;
  bVar1 = true;
LAB_0011f2f1:
  __return_storage_ptr__->m_init = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> Device::get_queue_index(QueueType type) const {
    uint32_t index = detail::QUEUE_INDEX_MAX_VALUE;
    switch (type) {
        case QueueType::present:
            index = detail::get_present_queue_index(physical_device.physical_device, surface, queue_families);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::present_unavailable };
            break;
        case QueueType::graphics:
            index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::graphics_unavailable };
            break;
        case QueueType::compute:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::compute_unavailable };
            break;
        case QueueType::transfer:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::transfer_unavailable };
            break;
        default:
            return Result<uint32_t>{ QueueError::invalid_queue_family_index };
    }
    return index;
}